

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FillLeftBelowEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  Orientation OVar2;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  dVar1 = node->point->x;
  if (edge->p->x <= dVar1 && dVar1 != edge->p->x) {
    OVar2 = Orient2d(node->point,node->prev->point,node->prev->prev->point);
    if (OVar2 == CW) {
      FillLeftConcaveEdgeEvent(this,tcx,edge,node);
    }
    else {
      FillLeftConvexEdgeEvent(this,tcx,edge,node);
      FillLeftBelowEdgeEvent(this,tcx,edge,node);
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftBelowEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  if (node.point->x > edge->p->x) {
    if (Orient2d(*node.point, *node.prev->point, *node.prev->prev->point) == CW) {
      // Concave
      FillLeftConcaveEdgeEvent(tcx, edge, node);
    } else {
      // Convex
      FillLeftConvexEdgeEvent(tcx, edge, node);
      // Retry this one
      FillLeftBelowEdgeEvent(tcx, edge, node);
    }
  }
}